

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SysInfo.cpp
# Opt level: O2

BOOL __thiscall AutoSystemInfo::SSE2Available(AutoSystemInfo *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if (this->initialized == false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/SysInfo.cpp"
                       ,0xfd,"(initialized)","initialized");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  return 1;
}

Assistant:

BOOL
AutoSystemInfo::SSE2Available() const
{
    Assert(initialized);

#if defined(_M_X64) || defined(_M_ARM32_OR_ARM64)
    return true;
#elif defined(_M_IX86)
#if defined(_WIN32)
    return VirtualSseAvailable(2) && (CPUInfo[3] & (1 << 26));
#else
    return false; // TODO: xplat support
#endif
#else
    return false;
#endif
}